

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,IStream *is,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  InputStreamMutex *pIVar3;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__DeepScanLineInputFile_003d33c8;
  pDVar2 = (Data *)operator_new(0x208);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pDVar2->_deleteStream = false;
  pDVar2->_streamData = (InputStreamMutex *)0x0;
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,is,&pDVar2->version);
  pDVar2 = this->_data;
  if ((pDVar2->version & 0x1000) == 0) {
    pIVar3 = (InputStreamMutex *)operator_new(0x38);
    (pIVar3->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    pIVar3->is = (IStream *)0x0;
    *(undefined8 *)((long)&(pIVar3->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pIVar3->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    pIVar3->currentPosition = 0;
    (pIVar3->super_mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pIVar3->super_mutex).super___mutex_base._M_mutex + 8) = 0;
    pDVar2->_streamData = pIVar3;
    pIVar3->is = is;
    iVar1 = (*is->_vptr_IStream[2])(is);
    pDVar2 = this->_data;
    pDVar2->memoryMapped = SUB41(iVar1,0);
    Header::readFrom(&pDVar2->header,pDVar2->_streamData->is,&pDVar2->version);
    Header::sanityCheck(&this->_data->header,(bool)((byte)((uint)this->_data->version >> 9) & 1),
                        false);
    initialize(this,&this->_data->header);
    pDVar2 = this->_data;
    anon_unknown_0::readLineOffsets
              (pDVar2->_streamData->is,pDVar2->lineOrder,&pDVar2->lineOffsets,
               &pDVar2->fileIsComplete);
  }
  else {
    compatibilityInitialize(this,is);
  }
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int numThreads)
    : _data (new Data (numThreads))
{
    _data->_deleteStream = false;
    _data->_streamData   = nullptr;

    try
    {
        readMagicNumberAndVersionField (is, _data->version);
        //
        // Backward compatibility to read multpart file.
        // multiPartInitialize will create _streamData
        if (isMultiPart (_data->version))
        {
            compatibilityInitialize (is);
            return;
        }
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot read image file "
            "\"" << is.fileName ()
                 << "\". " << e.what ());
        throw;
    }

    //
    // not multiPart - allocate stream data and initialise as normal
    //
    try
    {
        _data->_streamData     = new InputStreamMutex ();
        _data->_streamData->is = &is;
        _data->memoryMapped    = is.isMemoryMapped ();
        _data->header.readFrom (*_data->_streamData->is, _data->version);
        _data->header.sanityCheck (isTiled (_data->version));

        initialize (_data->header);

        readLineOffsets (
            *_data->_streamData->is,
            _data->lineOrder,
            _data->lineOffsets,
            _data->fileIsComplete);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data && _data->_streamData) { delete _data->_streamData; }
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot read image file "
            "\"" << is.fileName ()
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        if (_data && _data->_streamData) { delete _data->_streamData; }
        if (_data) delete _data;

        throw;
    }
}